

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

void * stbtt__hheap_alloc(stbtt__hheap *hh,size_t size,void *userdata)

{
  long *plVar1;
  ulong in_RSI;
  long *in_RDI;
  stbtt__hheap_chunk *c;
  int count;
  void *p;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  long *local_8;
  
  if (in_RDI[1] == 0) {
    if ((int)in_RDI[2] == 0) {
      if (in_RSI < 0x20) {
        uVar2 = 2000;
      }
      else {
        uVar2 = 100;
        if (in_RSI < 0x80) {
          uVar2 = 800;
        }
      }
      plVar1 = (long *)ImGui::MemAlloc(CONCAT44(uVar2,in_stack_ffffffffffffffc0));
      if (plVar1 == (long *)0x0) {
        return (void *)0x0;
      }
      *plVar1 = *in_RDI;
      *in_RDI = (long)plVar1;
      *(undefined4 *)(in_RDI + 2) = uVar2;
    }
    *(int *)(in_RDI + 2) = (int)in_RDI[2] + -1;
    local_8 = (long *)(*in_RDI + 8 + in_RSI * (long)(int)in_RDI[2]);
  }
  else {
    local_8 = (long *)in_RDI[1];
    in_RDI[1] = *local_8;
  }
  return local_8;
}

Assistant:

static void *stbtt__hheap_alloc(stbtt__hheap *hh, size_t size, void *userdata)
{
   if (hh->first_free) {
      void *p = hh->first_free;
      hh->first_free = * (void **) p;
      return p;
   } else {
      if (hh->num_remaining_in_head_chunk == 0) {
         int count = (size < 32 ? 2000 : size < 128 ? 800 : 100);
         stbtt__hheap_chunk *c = (stbtt__hheap_chunk *) STBTT_malloc(sizeof(stbtt__hheap_chunk) + size * count, userdata);
         if (c == NULL)
            return NULL;
         c->next = hh->head;
         hh->head = c;
         hh->num_remaining_in_head_chunk = count;
      }
      --hh->num_remaining_in_head_chunk;
      return (char *) (hh->head) + sizeof(stbtt__hheap_chunk) + size * hh->num_remaining_in_head_chunk;
   }
}